

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O2

void __thiscall
iutest::detail::iuBoolParamsGenerator::~iuBoolParamsGenerator(iuBoolParamsGenerator *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

class iuBoolParamsGenerator IUTEST_CXX_FINAL : public iuIParamGenerator<bool>
{
    int m_n;
    bool m_cur;
public:
    iuBoolParamsGenerator()
        : m_n(0)
        , m_cur(false)
    {}

public:
    virtual void    Begin() IUTEST_CXX_OVERRIDE { m_cur = false; m_n = 0; }